

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetRepeatedMessage
          (ExtensionSet *this,int number,int index)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  pointer ppVar4;
  MessageLite *pMVar5;
  LogFinisher local_f2;
  byte local_f1;
  LogMessage local_f0;
  LogFinisher local_b2;
  byte local_b1;
  LogMessage local_b0;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  _Self local_28;
  _Self local_20;
  const_iterator iter;
  int index_local;
  int number_local;
  ExtensionSet *this_local;
  
  iter._M_node._0_4_ = index;
  iter._M_node._4_4_ = number;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::find(&this->extensions_,(key_type *)((long)&iter._M_node + 4));
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
       ::end(&this->extensions_);
  bVar1 = std::operator!=(&local_20,&local_28);
  local_61 = 0;
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2d5);
    local_61 = 1;
    pLVar3 = LogMessage::operator<<(&local_60,"CHECK failed: iter != extensions_.end(): ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=(local_75,pLVar3);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_20);
  local_b1 = 0;
  if (((ppVar4->second).is_repeated & 1U) == 0) {
    LogMessage::LogMessage
              (&local_b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2d6);
    local_b1 = 1;
    pLVar3 = LogMessage::operator<<
                       (&local_b0,
                        "CHECK failed: ((iter->second).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                       );
    LogFinisher::operator=(&local_b2,pLVar3);
  }
  if ((local_b1 & 1) != 0) {
    LogMessage::~LogMessage(&local_b0);
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_20);
  CVar2 = anon_unknown_29::cpp_type((ppVar4->second).type);
  local_f1 = 0;
  if (CVar2 != CPPTYPE_MESSAGE) {
    LogMessage::LogMessage
              (&local_f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x2d6);
    local_f1 = 1;
    pLVar3 = LogMessage::operator<<
                       (&local_f0,
                        "CHECK failed: (cpp_type((iter->second).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                       );
    LogFinisher::operator=(&local_f2,pLVar3);
  }
  if ((local_f1 & 1) != 0) {
    LogMessage::~LogMessage(&local_f0);
  }
  ppVar4 = std::
           _Rb_tree_const_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
           ::operator->(&local_20);
  pMVar5 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                     ((ppVar4->second).field_0.repeated_message_value,(int)iter._M_node);
  return pMVar5;
}

Assistant:

const MessageLite& ExtensionSet::GetRepeatedMessage(
    int number, int index) const {
  ExtensionMap::const_iterator iter = extensions_.find(number);
  GOOGLE_CHECK(iter != extensions_.end()) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(iter->second, REPEATED, MESSAGE);
  return iter->second.repeated_message_value->Get(index);
}